

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

void __thiscall
Catch::XmlReporter::listTests
          (XmlReporter *this,
          vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *tests)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  TestCaseInfo *this_00;
  char *__s;
  ulong __val;
  bool bVar2;
  StringRef text;
  StringRef text_00;
  StringRef text_01;
  char cVar3;
  size_t sVar4;
  ulong uVar5;
  XmlFormatting fmt;
  XmlWriter *this_01;
  char cVar6;
  pointer pTVar7;
  StringRef text_02;
  string __str;
  ScopedElement sourceTag;
  ScopedElement innerTag;
  ScopedElement outerTag;
  string local_a8;
  string local_88;
  pointer local_68;
  ScopedElement local_60;
  ScopedElement local_50;
  
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"MatchingTests","");
  this_01 = &this->m_xml;
  fmt = (XmlFormatting)&local_a8;
  XmlWriter::scopedElement((XmlWriter *)&stack0xffffffffffffffc0,(string *)this_01,fmt);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  pTVar7 = (tests->super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_68 = (tests->
             super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>).
             _M_impl.super__Vector_impl_data._M_finish;
  if (pTVar7 != local_68) {
    paVar1 = &local_88.field_2;
    do {
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"TestCase","");
      XmlWriter::scopedElement((XmlWriter *)&local_50,(string *)this_01,fmt);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      this_00 = pTVar7->m_info;
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"Name","");
      XmlWriter::startElement(this_01,&local_a8,Indent);
      text.m_start = (this_00->name)._M_dataplus._M_p;
      text.m_size = (this_00->name)._M_string_length;
      XmlWriter::writeText(this_01,text,None);
      XmlWriter::endElement(this_01,Newline);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"ClassName","");
      XmlWriter::startElement(this_01,&local_a8,Indent);
      XmlWriter::writeText(this_01,this_00->className,None);
      XmlWriter::endElement(this_01,Newline);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"Tags","");
      XmlWriter::startElement(this_01,&local_a8,Indent);
      TestCaseInfo::tagsAsString_abi_cxx11_(&local_88,this_00);
      text_00.m_size._0_4_ = (uint)local_88._M_string_length;
      text_00.m_start = local_88._M_dataplus._M_p;
      text_00.m_size._4_4_ = local_88._M_string_length._4_4_;
      XmlWriter::writeText(this_01,text_00,None);
      XmlWriter::endElement(this_01,Newline);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != paVar1) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"SourceInfo","");
      XmlWriter::scopedElement((XmlWriter *)&local_60,(string *)this_01,fmt);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"File","");
      XmlWriter::startElement(this_01,&local_a8,Indent);
      __s = (this_00->lineInfo).file;
      sVar4 = strlen(__s);
      text_02.m_size = sVar4;
      text_02.m_start = __s;
      XmlWriter::writeText(this_01,text_02,None);
      XmlWriter::endElement(this_01,Newline);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"Line","");
      XmlWriter::startElement(this_01,&local_a8,Indent);
      __val = (this_00->lineInfo).line;
      cVar6 = '\x01';
      if (9 < __val) {
        uVar5 = __val;
        cVar3 = '\x04';
        do {
          cVar6 = cVar3;
          if (uVar5 < 100) {
            cVar6 = cVar6 + -2;
            goto LAB_0016afe3;
          }
          if (uVar5 < 1000) {
            cVar6 = cVar6 + -1;
            goto LAB_0016afe3;
          }
          if (uVar5 < 10000) goto LAB_0016afe3;
          bVar2 = 99999 < uVar5;
          uVar5 = uVar5 / 10000;
          cVar3 = cVar6 + '\x04';
        } while (bVar2);
        cVar6 = cVar6 + '\x01';
      }
LAB_0016afe3:
      local_88._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct((ulong)&local_88,cVar6);
      std::__detail::__to_chars_10_impl<unsigned_long>
                (local_88._M_dataplus._M_p,(uint)local_88._M_string_length,__val);
      text_01.m_size._0_4_ = (uint)local_88._M_string_length;
      text_01.m_start = local_88._M_dataplus._M_p;
      text_01.m_size._4_4_ = local_88._M_string_length._4_4_;
      XmlWriter::writeText(this_01,text_01,None);
      XmlWriter::endElement(this_01,Newline);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != paVar1) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      XmlWriter::ScopedElement::~ScopedElement(&local_60);
      XmlWriter::ScopedElement::~ScopedElement(&local_50);
      pTVar7 = pTVar7 + 1;
    } while (pTVar7 != local_68);
  }
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)&stack0xffffffffffffffc0);
  return;
}

Assistant:

void XmlReporter::listTests(std::vector<TestCaseHandle> const& tests) {
        auto outerTag = m_xml.scopedElement("MatchingTests");
        for (auto const& test : tests) {
            auto innerTag = m_xml.scopedElement("TestCase");
            auto const& testInfo = test.getTestCaseInfo();
            m_xml.startElement("Name", XmlFormatting::Indent)
                 .writeText(testInfo.name, XmlFormatting::None)
                 .endElement(XmlFormatting::Newline);
            m_xml.startElement("ClassName", XmlFormatting::Indent)
                 .writeText(testInfo.className, XmlFormatting::None)
                 .endElement(XmlFormatting::Newline);
            m_xml.startElement("Tags", XmlFormatting::Indent)
                 .writeText(testInfo.tagsAsString(), XmlFormatting::None)
                 .endElement(XmlFormatting::Newline);

            auto sourceTag = m_xml.scopedElement("SourceInfo");
            m_xml.startElement("File", XmlFormatting::Indent)
                 .writeText(testInfo.lineInfo.file, XmlFormatting::None)
                 .endElement(XmlFormatting::Newline);
            m_xml.startElement("Line", XmlFormatting::Indent)
                 .writeText(std::to_string(testInfo.lineInfo.line), XmlFormatting::None)
                 .endElement(XmlFormatting::Newline);
        }
    }